

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

code_point __thiscall
tcb::unicode::detail::utf_traits<char16_t,2>::
decode<std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>,std::istreambuf_iterator<char16_t,std::char_traits<char16_t>>>
          (utf_traits<char16_t,2> *this,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *current,
          istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last)

{
  streambuf_type *psVar1;
  char_type_conflict1 *pcVar2;
  bool bVar3;
  int_type iVar4;
  int_type iVar5;
  int iVar6;
  code_point cVar7;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> local_48;
  istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> last_local;
  
  last_local._M_c = (int_type)last._M_sbuf;
  last_local._M_sbuf = (streambuf_type *)current;
  iVar4 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get
                    ((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this);
  iVar5 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&last_local);
  cVar7 = L'\xfffffffe';
  if ((iVar5 != 0xffff) == (iVar4 == 0xffff)) {
    psVar1 = *(streambuf_type **)this;
    pcVar2 = psVar1->_M_in_cur;
    if (pcVar2 < psVar1->_M_in_end) {
      local_48._M_c = L'�';
      if (*pcVar2 != L'\xffff') {
        local_48._M_c = *pcVar2;
      }
      psVar1->_M_in_cur = pcVar2 + 1;
    }
    else {
      iVar6 = (*psVar1->_vptr_basic_streambuf[10])(psVar1);
      local_48._M_c = (int_type)iVar6;
    }
    *(undefined2 *)(this + 8) = 0xffff;
    local_48._M_sbuf = psVar1;
    iVar4 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&local_48);
    if ((ushort)(iVar4 + 0x2000) < 0xf800) {
      cVar7 = (uint)iVar4;
    }
    else {
      cVar7 = L'\xffffffff';
      if ((iVar4 < 0xdc00) &&
         (bVar3 = std::operator==((istreambuf_iterator<char16_t,_std::char_traits<char16_t>_> *)this
                                  ,&last_local), cVar7 = L'\xfffffffe', !bVar3)) {
        psVar1 = *(streambuf_type **)this;
        pcVar2 = psVar1->_M_in_cur;
        if (pcVar2 < psVar1->_M_in_end) {
          local_48._M_c = L'�';
          if (*pcVar2 != L'\xffff') {
            local_48._M_c = *pcVar2;
          }
          psVar1->_M_in_cur = pcVar2 + 1;
        }
        else {
          iVar6 = (*psVar1->_vptr_basic_streambuf[10])(psVar1);
          local_48._M_c = (int_type)iVar6;
        }
        *(undefined2 *)(this + 8) = 0xffff;
        local_48._M_sbuf = psVar1;
        iVar5 = std::istreambuf_iterator<char16_t,_std::char_traits<char16_t>_>::_M_get(&local_48);
        cVar7 = L'\xffffffff';
        if (0xfbff < (ushort)(iVar5 + 0x2000)) {
          cVar7 = (iVar4 & 0x3ff) * 0x400 + (iVar5 & 0x3ff) + L'𐀀';
        }
      }
    }
  }
  return cVar7;
}

Assistant:

static TCB_CONSTEXPR14 code_point decode(It& current, S last)
    {
        if (TCB_UNLIKELY(current == last))
            return incomplete;
        uint16_t w1 = *current++;
        if (TCB_LIKELY(w1 < 0xD800 || 0xDFFF < w1)) {
            return w1;
        }
        if (w1 > 0xDBFF)
            return illegal;
        if (current == last)
            return incomplete;
        uint16_t w2 = *current++;
        if (w2 < 0xDC00 || 0xDFFF < w2)
            return illegal;
        return combine_surrogate(w1, w2);
    }